

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<std::error_code> *
testing::internal::ActionResultHolder<std::error_code>::
PerformAction<std::error_code(unsigned_long)>
          (Action<std::error_code_(unsigned_long)> *action,ArgumentTuple *args)

{
  ActionResultHolder<std::error_code> *pAVar1;
  Result RVar2;
  _Head_base<0UL,_unsigned_long,_false> local_20;
  
  pAVar1 = (ActionResultHolder<std::error_code> *)operator_new(0x18);
  local_20._M_head_impl =
       (args->super__Tuple_impl<0UL,_unsigned_long>).super__Head_base<0UL,_unsigned_long,_false>.
       _M_head_impl;
  RVar2 = Action<std::error_code_(unsigned_long)>::Perform(action,(ArgumentTuple *)&local_20);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_001a8b28;
  (pAVar1->result_).value_._M_value = RVar2._M_value;
  (pAVar1->result_).value_._M_cat = RVar2._M_cat;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }